

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O1

void __thiscall FGLRenderer::BindTonemapPalette(FGLRenderer *this,int texunit)

{
  BYTE BVar1;
  BYTE BVar2;
  uchar *buffer;
  uint uVar3;
  FHardwareTexture *this_00;
  FShaderManager *pFVar4;
  ulong uVar5;
  ulong uVar6;
  FGLRenderer *this_01;
  uint *puVar7;
  long lVar8;
  TArray<unsigned_char,_unsigned_char> lut;
  FString local_58;
  AActor *local_50;
  FShaderManager *local_48;
  uint *local_40;
  ulong local_38;
  
  this_01 = (FGLRenderer *)&lut;
  if (this->mTonemapPalette != (FHardwareTexture *)0x0) {
    FHardwareTexture::Bind(this->mTonemapPalette,texunit,0,false);
    return;
  }
  lut.Array = (uchar *)0x0;
  lut.Most = 0;
  lut.Count = 0;
  local_50 = (AActor *)this;
  TArray<unsigned_char,_unsigned_char>::Resize(&lut,0x100000);
  puVar7 = (uint *)0x0;
  pFVar4 = (FShaderManager *)0x0;
  do {
    uVar5 = 0;
    local_48 = pFVar4;
    local_40 = puVar7;
    do {
      lVar8 = 0;
      uVar6 = 0;
      local_38 = uVar5;
      do {
        uVar3 = PTM_BestColor(this_01,(uint32 *)&GPalette,
                              ((uint)((ulong)pFVar4 >> 4) & 0xfffffff) + (int)pFVar4 * 4,
                              ((uint)(uVar5 >> 4) & 0xfffffff) + (int)uVar5 * 4,
                              (int)(uVar6 >> 4) + (int)lVar8,0,0x100);
        uVar3 = uVar3 & 0xff;
        BVar1 = GPalette.BaseColors[uVar3].field_0.field_0.b;
        BVar2 = GPalette.BaseColors[uVar3].field_0.field_0.g;
        (lut.Array + (long)puVar7)[lVar8] = GPalette.BaseColors[uVar3].field_0.field_0.r;
        (lut.Array + (long)puVar7)[lVar8 + 1] = BVar2;
        (lut.Array + (long)puVar7)[lVar8 + 2] = BVar1;
        (lut.Array + (long)puVar7)[lVar8 + 3] = 0xff;
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x100);
      uVar5 = local_38 + 1;
      puVar7 = puVar7 + 0x40;
    } while (uVar5 != 0x40);
    pFVar4 = (FShaderManager *)((long)&(local_48->mTextureEffects).Array + 1);
    puVar7 = local_40 + 0x1000;
  } while (pFVar4 != (FShaderManager *)0x40);
  this_00 = (FHardwareTexture *)operator_new(0x30);
  FHardwareTexture::FHardwareTexture(this_00,0x200,0x200,true);
  buffer = lut.Array;
  (local_50->SpriteRotation).Degrees = (double)this_00;
  FString::FString(&local_58,"mTonemapPalette");
  FHardwareTexture::CreateTexture(this_00,buffer,0x200,0x200,texunit,false,0,&local_58);
  FString::~FString(&local_58);
  (*_ptrc_glActiveTexture)(texunit + 0x84c0);
  (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2600);
  (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2600);
  (*_ptrc_glTexParameteri)(0xde1,0x2802,0x812f);
  (*_ptrc_glTexParameteri)(0xde1,0x2803,0x812f);
  (*_ptrc_glActiveTexture)(0x84c0);
  TArray<unsigned_char,_unsigned_char>::~TArray(&lut);
  return;
}

Assistant:

void FGLRenderer::BindTonemapPalette(int texunit)
{
	if (mTonemapPalette)
	{
		mTonemapPalette->Bind(texunit, 0, false);
	}
	else
	{
		TArray<unsigned char> lut;
		lut.Resize(512 * 512 * 4);
		for (int r = 0; r < 64; r++)
		{
			for (int g = 0; g < 64; g++)
			{
				for (int b = 0; b < 64; b++)
				{
					PalEntry color = GPalette.BaseColors[(BYTE)PTM_BestColor((uint32 *)GPalette.BaseColors, (r << 2) | (r >> 4), (g << 2) | (g >> 4), (b << 2) | (b >> 4), 0, 256)];
					int index = ((r * 64 + g) * 64 + b) * 4;
					lut[index] = color.r;
					lut[index + 1] = color.g;
					lut[index + 2] = color.b;
					lut[index + 3] = 255;
				}
			}
		}

		mTonemapPalette = new FHardwareTexture(512, 512, true);
		mTonemapPalette->CreateTexture(&lut[0], 512, 512, texunit, false, 0, "mTonemapPalette");

		glActiveTexture(GL_TEXTURE0 + texunit);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glActiveTexture(GL_TEXTURE0);
	}
}